

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server_extension.c
# Opt level: O1

apx_error_t apx_socketServerExtension_init(apx_server_tag *apx_server,dtl_dv_t *config)

{
  int iVar1;
  uint uVar2;
  undefined8 in_RAX;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  char *tag;
  apx_error_t aVar8;
  char local_31;
  
  local_31 = (char)((ulong)in_RAX >> 0x38);
  aVar8 = 0;
  if (m_instance == (apx_socketServer_t *)0x0) {
    m_instance = apx_socketServer_new(apx_server);
    if (m_instance == (apx_socketServer_t *)0x0) {
      aVar8 = 2;
    }
    else {
      aVar8 = 0;
      if (config != (dtl_dv_t *)0x0) {
        iVar1 = dtl_dv_type(config);
        aVar8 = 0x43;
        if (iVar1 == 4) {
          lVar3 = dtl_hv_get_cstr(config,"tcp-port");
          lVar4 = dtl_hv_get_cstr(config,"unix-file");
          lVar5 = dtl_hv_get_cstr(config,"tcp-tag");
          lVar6 = dtl_hv_get_cstr(config,"unix-tag");
          if (lVar3 != 0) {
            uVar2 = dtl_sv_to_u32(lVar3,&local_31);
            if ((local_31 == '\x01') && ((uVar2 & 0xfc00) - 0x400 < 0xbc00)) {
              if (lVar5 == 0) {
                pcVar7 = "";
              }
              else {
                pcVar7 = (char *)dtl_sv_to_cstr(lVar5,&local_31);
              }
              apx_socketServer_start_tcp_server(m_instance,(uint16_t)uVar2,pcVar7);
            }
          }
          if (lVar4 != 0) {
            pcVar7 = (char *)dtl_sv_to_cstr(lVar4,&local_31);
            if ((local_31 == '\x01') && (*pcVar7 != '\0')) {
              if (lVar6 == 0) {
                tag = "";
              }
              else {
                tag = (char *)dtl_sv_to_cstr(lVar6,&local_31);
              }
              apx_socketServer_start_unix_server(m_instance,pcVar7,tag);
            }
          }
          aVar8 = 0;
        }
      }
    }
  }
  return aVar8;
}

Assistant:

static apx_error_t apx_socketServerExtension_init(struct apx_server_tag *apx_server, dtl_dv_t *config)
{
   if (m_instance == 0)
   {
      m_instance = apx_socketServer_new(apx_server);
      if (m_instance == 0)
      {
         return APX_MEM_ERROR;
      }
      if (config != 0)
      {
         if (dtl_dv_type(config) == DTL_DV_HASH)
         {
            return apx_socketServerExtension_configure(m_instance, (dtl_hv_t*) config);
         }
         else
         {
            return APX_VALUE_TYPE_ERROR;
         }
      }
   }
   return APX_NO_ERROR;
}